

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O0

void __thiscall XPMP2::SoundSystemFMOD::SoundLogEnable(SoundSystemFMOD *this,bool bEnable)

{
  byte in_SIL;
  undefined8 uVar1;
  char *pcVar2;
  undefined4 in_stack_fffffffffffffef0;
  int iVar3;
  allocator<char> local_f1;
  string local_f0 [16];
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string local_c8 [32];
  string *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string local_90 [4];
  FMOD_RESULT in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  FmodError *in_stack_ffffffffffffff80;
  
  uVar1 = 0;
  if ((in_SIL & 1) != 0) {
    uVar1 = 4;
  }
  gFmodRes = FMOD_Debug_Initialize(uVar1,2,SoundLogCB,0);
  if (gFmodRes == 0) {
    if (glob < 1) {
      pcVar2 = "disabled";
      if ((in_SIL & 1) != 0) {
        pcVar2 = "enabled";
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
             ,0xd7,"SoundLogEnable",logDEBUG,"FMOD logging has been %s.",pcVar2);
    }
  }
  else if (gFmodRes != 0x44) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    iVar3 = gFmodRes;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    FmodError::FmodError
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
    FmodError::~FmodError((FmodError *)CONCAT44(iVar3,in_stack_fffffffffffffef0));
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  }
  return;
}

Assistant:

void SoundSystemFMOD::SoundLogEnable (bool bEnable)
{
    gFmodRes = FMOD_Debug_Initialize(bEnable ? FMOD_DEBUG_LEVEL_LOG : FMOD_DEBUG_LEVEL_NONE,
                                     FMOD_DEBUG_MODE_CALLBACK, SoundLogCB, nullptr);
    if (gFmodRes == FMOD_OK) {
        LOG_MSG(logDEBUG, "FMOD logging has been %s.", bEnable ? "enabled" : "disabled");
    }
    // FMOD_ERR_UNSUPPORTED just means: not linked to fmodL, ie. "normal"
    else if (gFmodRes != FMOD_ERR_UNSUPPORTED)
    {
        FmodError("FMOD_Debug_Initialize", gFmodRes, __FILE__, __LINE__, __func__);
    }
}